

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O0

cio_error cio_uart_set_flow_control(cio_uart *port,cio_uart_flow_control flow_control)

{
  undefined1 local_58 [4];
  cio_error err;
  termios tty;
  cio_uart_flow_control flow_control_local;
  cio_uart *port_local;
  
  if (port == (cio_uart *)0x0) {
    port_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else {
    tty.c_ispeed = flow_control;
    unique0x100000b1 = port;
    port_local._4_4_ = get_current_settings(port,(termios *)local_58);
    if (port_local._4_4_ == CIO_SUCCESS) {
      if (tty.c_ispeed == 0) {
        tty.c_iflag = tty.c_iflag & 0x7fffffff;
        local_58 = (undefined1  [4])((uint)local_58 & 0xffffe3ff);
      }
      else if (tty.c_ispeed == 1) {
        local_58 = (undefined1  [4])((uint)local_58 & 0xffffe3ff);
        tty.c_iflag = tty.c_iflag | 0x80000000;
      }
      else {
        if (tty.c_ispeed != 2) {
          return CIO_INVALID_ARGUMENT;
        }
        tty.c_iflag = tty.c_iflag & 0x7fffffff;
        local_58 = (undefined1  [4])((uint)local_58 | 0x1c00);
      }
      port_local._4_4_ = set_termios((stack0xffffffffffffffe8->impl).ev.fd,(termios *)local_58);
      if (port_local._4_4_ == CIO_SUCCESS) {
        port_local._4_4_ = CIO_SUCCESS;
      }
    }
  }
  return port_local._4_4_;
}

Assistant:

enum cio_error cio_uart_set_flow_control(const struct cio_uart *port, enum cio_uart_flow_control flow_control)
{
	if (cio_unlikely(port == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	struct termios tty;
	enum cio_error err = get_current_settings(port, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	switch (flow_control) {
	case CIO_UART_FLOW_CONTROL_NONE:
		tty.c_cflag &= ~(tcflag_t)CRTSCTS;
		tty.c_iflag &= ~((tcflag_t)IXON | (tcflag_t)IXOFF | (tcflag_t)IXANY);
		break;
	case CIO_UART_FLOW_CONTROL_RTS_CTS:
		tty.c_iflag &= ~((tcflag_t)IXON | (tcflag_t)IXOFF | (tcflag_t)IXANY);
		tty.c_cflag |= (tcflag_t)CRTSCTS;
		break;
	case CIO_UART_FLOW_CONTROL_XON_XOFF:
		tty.c_cflag &= ~(tcflag_t)CRTSCTS;
		tty.c_iflag |= ((tcflag_t)IXON | (tcflag_t)IXOFF | (tcflag_t)IXANY);
		break;
	default:
		return CIO_INVALID_ARGUMENT;
	}

	err = set_termios(port->impl.ev.fd, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	return CIO_SUCCESS;
}